

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O2

void __thiscall
dna_bwt_n<dna_string_n>::next_leaves
          (dna_bwt_n<dna_string_n> *this,sa_leaf *L,
          vector<sa_leaf,_std::allocator<sa_leaf>_> *TMP_LEAVES,int *t,int min_n_children)

{
  pointer psVar1;
  uint64_t uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  p_range_n ext;
  p_range_n local_80;
  
  *t = 0;
  LF(&local_80,this,L->rn);
  uVar2 = L->depth + 1;
  uVar4 = (ulong)min_n_children;
  iVar3 = *t;
  iVar5 = iVar3;
  if (uVar4 <= local_80.A.second - local_80.A.first) {
    iVar5 = iVar3 + 1;
    *t = iVar5;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar3].rn.first = local_80.A.first;
    psVar1[iVar3].rn.second = local_80.A.second;
    psVar1[iVar3].depth = uVar2;
  }
  iVar3 = iVar5;
  if (uVar4 <= local_80.C.second - local_80.C.first) {
    iVar3 = iVar5 + 1;
    *t = iVar3;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar5].rn.first = local_80.C.first;
    psVar1[iVar5].rn.second = local_80.C.second;
    psVar1[iVar5].depth = uVar2;
  }
  iVar5 = iVar3;
  if (uVar4 <= local_80.G.second - local_80.G.first) {
    iVar5 = iVar3 + 1;
    *t = iVar5;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar3].rn.first = local_80.G.first;
    psVar1[iVar3].rn.second = local_80.G.second;
    psVar1[iVar3].depth = uVar2;
  }
  iVar3 = iVar5;
  if (uVar4 <= local_80.N.second - local_80.N.first) {
    iVar3 = iVar5 + 1;
    *t = iVar3;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar5].rn.first = local_80.N.first;
    psVar1[iVar5].rn.second = local_80.N.second;
    psVar1[iVar5].depth = uVar2;
  }
  iVar5 = iVar3;
  if (uVar4 <= local_80.T.second - local_80.T.first) {
    iVar5 = iVar3 + 1;
    *t = iVar5;
    psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1[iVar3].rn.first = local_80.T.first;
    psVar1[iVar3].rn.second = local_80.T.second;
    psVar1[iVar3].depth = uVar2;
  }
  psVar1 = (TMP_LEAVES->super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::
  __sort<__gnu_cxx::__normal_iterator<sa_leaf*,std::vector<sa_leaf,std::allocator<sa_leaf>>>,__gnu_cxx::__ops::_Iter_comp_iter<dna_bwt_n<dna_string_n>::next_leaves(sa_leaf&,std::vector<sa_leaf,std::allocator<sa_leaf>>&,int&,int)::_lambda(sa_leaf_const&,sa_leaf_const&)_1_>>
            (psVar1,psVar1 + iVar5);
  return;
}

Assistant:

void next_leaves(sa_leaf & L, vector<sa_leaf> & TMP_LEAVES, int & t, int min_n_children){

		t = 0;

		p_range_n ext = LF(L.rn);

		sa_leaf A = {ext.A, L.depth+1};
		sa_leaf C = {ext.C, L.depth+1};
		sa_leaf G = {ext.G, L.depth+1};
		sa_leaf N = {ext.N, L.depth+1};
		sa_leaf T = {ext.T, L.depth+1};

		if(leaf_size(A)>=min_n_children) TMP_LEAVES[t++] = A;
		if(leaf_size(C)>=min_n_children) TMP_LEAVES[t++] = C;
		if(leaf_size(G)>=min_n_children) TMP_LEAVES[t++] = G;
		if(leaf_size(N)>=min_n_children) TMP_LEAVES[t++] = N;
		if(leaf_size(T)>=min_n_children) TMP_LEAVES[t++] = T;

		std::sort( TMP_LEAVES.begin(), TMP_LEAVES.begin()+t, [ ]( const sa_leaf& lhs, const sa_leaf& rhs )
		{
			return leaf_size(lhs) < leaf_size(rhs);
		});

	}